

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# power.c
# Opt level: O0

int envy_bios_parse_power_cstep(envy_bios *bios)

{
  uint uVar1;
  envy_bios_power_cstep_entry2 *peVar2;
  ushort local_2e;
  uint32_t data_1;
  uint uStack_28;
  uint16_t tmp;
  uint32_t data;
  int err;
  int i;
  envy_bios_power_cstep *cstep;
  envy_bios *bios_local;
  
  _err = &(bios->power).cstep;
  uStack_28 = 0;
  if (_err->offset == 0) {
    bios_local._4_4_ = -0x16;
  }
  else {
    cstep = (envy_bios_power_cstep *)bios;
    bios_u8(bios,_err->offset,&(bios->power).cstep.version);
    if (_err->version == '\x10') {
      uVar1 = bios_u8((envy_bios *)cstep,_err->offset + 1,&_err->hlen);
      uStack_28 = uVar1 | uStack_28;
      uVar1 = bios_u8((envy_bios *)cstep,_err->offset + 2,&_err->rlen);
      uStack_28 = uVar1 | uStack_28;
      uVar1 = bios_u8((envy_bios *)cstep,_err->offset + 3,&_err->entriesnum);
      uStack_28 = uVar1 | uStack_28;
      uVar1 = bios_u8((envy_bios *)cstep,_err->offset + 4,&_err->ssz);
      uStack_28 = uVar1 | uStack_28;
      uVar1 = bios_u8((envy_bios *)cstep,_err->offset + 5,&_err->snr);
      uStack_28 = uVar1 | uStack_28;
      _err->valid = (uStack_28 != 0 ^ 0xffU) & 1;
      if (8 < _err->entriesnum) {
        __assert_fail("cstep->entriesnum <= (sizeof(cstep->ent1) / sizeof(struct envy_bios_power_cstep_entry1))"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/envytools[P]envytools/nvbios/power.c"
                      ,0x245,"int envy_bios_parse_power_cstep(struct envy_bios *)");
      }
      for (data = 0; (int)data < (int)(uint)_err->entriesnum; data = data + 1) {
        data_1 = _err->offset + (uint)_err->hlen + data * _err->rlen;
        uVar1 = bios_u16((envy_bios *)cstep,data_1,&local_2e);
        uStack_28 = uVar1 | uStack_28;
        _err->ent1[(int)data].offset = data_1;
        _err->ent1[(int)data].pstate = (uint8_t)((int)(local_2e & 0x1e0) >> 5);
        bios_u8((envy_bios *)cstep,data_1 + 3,&_err->ent1[(int)data].index);
      }
      peVar2 = (envy_bios_power_cstep_entry2 *)malloc((ulong)_err->snr * 0xc);
      _err->ent2 = peVar2;
      memset(_err->ent2,0,(ulong)_err->snr * 0xc);
      for (data = 0; (int)data < (int)(uint)_err->snr; data = data + 1) {
        uVar1 = _err->offset + (uint)_err->hlen + (uint)_err->entriesnum * (uint)_err->rlen +
                data * _err->ssz;
        _err->ent2[(int)data].offset = uVar1;
        bios_u16((envy_bios *)cstep,uVar1,&_err->ent2[(int)data].freq);
        bios_u8((envy_bios *)cstep,uVar1 + 2,_err->ent2[(int)data].unkn);
        bios_u8((envy_bios *)cstep,uVar1 + 3,_err->ent2[(int)data].unkn + 1);
        bios_u8((envy_bios *)cstep,uVar1 + 4,&_err->ent2[(int)data].voltage);
        _err->ent2[(int)data].valid = _err->ent2[(int)data].freq != 0;
      }
      bios_local._4_4_ = 0;
    }
    else {
      fprintf(_stderr,"Unknown CSTEP table version 0x%x\n",(ulong)_err->version);
      bios_local._4_4_ = -0x16;
    }
  }
  return bios_local._4_4_;
}

Assistant:

int envy_bios_parse_power_cstep(struct envy_bios *bios) {
	struct envy_bios_power_cstep *cstep = &bios->power.cstep;
	int i, err = 0;

	if (!cstep->offset)
		return -EINVAL;

	bios_u8(bios, cstep->offset + 0x0, &cstep->version);
	switch(cstep->version) {
	case 0x10:
		err |= bios_u8(bios, cstep->offset + 0x1, &cstep->hlen);
		err |= bios_u8(bios, cstep->offset + 0x2, &cstep->rlen);
		err |= bios_u8(bios, cstep->offset + 0x3, &cstep->entriesnum);
		err |= bios_u8(bios, cstep->offset + 0x4, &cstep->ssz);
		err |= bios_u8(bios, cstep->offset + 0x5, &cstep->snr);
		cstep->valid = !err;
		break;
	default:
		ENVY_BIOS_ERR("Unknown CSTEP table version 0x%x\n", cstep->version);
		return -EINVAL;
	};

	assert(cstep->entriesnum <= (sizeof(cstep->ent1) / sizeof(struct envy_bios_power_cstep_entry1)));
	for (i = 0; i < cstep->entriesnum; i++) {
		uint32_t data = cstep->offset + cstep->hlen + i * cstep->rlen;

		uint16_t tmp;
		err |= bios_u16(bios, data + 0x0, &tmp);

		cstep->ent1[i].offset = data;
		cstep->ent1[i].pstate = (tmp & 0x01e0) >> 5;
		bios_u8(bios, data + 0x3, &cstep->ent1[i].index);
	}

	cstep->ent2 = malloc(cstep->snr * sizeof(struct envy_bios_power_cstep_entry2));
	memset(cstep->ent2, 0x0, cstep->snr * sizeof(struct envy_bios_power_cstep_entry2));
	for (i = 0; i < cstep->snr; i++) {
		uint32_t data = cstep->offset + cstep->hlen + (cstep->entriesnum * cstep->rlen) + (i * cstep->ssz);

		cstep->ent2[i].offset = data;
		bios_u16(bios, data + 0x0, &cstep->ent2[i].freq);
		bios_u8(bios, data + 0x2, &cstep->ent2[i].unkn[0]);
		bios_u8(bios, data + 0x3, &cstep->ent2[i].unkn[1]);
		bios_u8(bios, data + 0x4, &cstep->ent2[i].voltage);
		cstep->ent2[i].valid = (cstep->ent2[i].freq > 0);
	}

	return 0;
}